

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_identify(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  undefined8 uVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  uint uVar11;
  CProficiencies *pCVar12;
  char buf [4608];
  char acStack_1238 [8];
  char acStack_1230 [10];
  char acStack_1226 [4598];
  
  pcVar10 = acStack_1238;
  bVar3 = is_npc(ch);
  bVar4 = true;
  if (!bVar3) {
    if (ch->pcdata == (PC_DATA *)0x0) {
      pCVar12 = &prof_none;
    }
    else {
      pCVar12 = &ch->pcdata->profs;
    }
    iVar5 = CProficiencies::GetProf(pCVar12,"forgotten lore");
    if (-1 < iVar5) {
      send_to_char("Your knowledge of forgotten lore grants you additional insight.\n\r",ch);
      if (ch->pcdata == (PC_DATA *)0x0) {
        pCVar12 = &prof_none;
      }
      else {
        pCVar12 = &ch->pcdata->profs;
      }
      CProficiencies::CheckImprove(pCVar12,"forgotten lore",100);
      bVar4 = false;
    }
  }
  uVar1 = *(undefined8 *)((long)vo + 0x80);
  pcVar7 = item_name_lookup((int)*(short *)((long)vo + 0x98));
  pcVar8 = extra_bit_name((long *)((long)vo + 0xa0));
  sprintf(acStack_1238,"Object \'%s\' is type %s, extra flags %s.\n\r",uVar1,pcVar7,pcVar8);
  sVar9 = strlen(acStack_1238);
  builtin_strncpy(acStack_1238 + sVar9,"It appea",8);
  builtin_strncpy(acStack_1230 + sVar9,"rs to be m",10);
  builtin_strncpy(acStack_1226 + sVar9,"ade of ",8);
  strcat(acStack_1238,*(char **)((long)vo + 0x110));
  sVar9 = strlen(acStack_1238);
  builtin_strncpy(acStack_1238 + sVar9,".\n\r",4);
  send_to_char(acStack_1238,ch);
  switch(*(short *)((long)vo + 0x98)) {
  case 3:
  case 4:
    sprintf(acStack_1238,"It is enchanted with %d charges of level %d",
            (ulong)*(uint *)((long)vo + 0x124),(ulong)*(uint *)((long)vo + 0x11c));
    send_to_char(acStack_1238,ch);
    pcVar10 = ".\n\r";
    if ((799 < (ulong)*(uint *)((long)vo + 0x128)) ||
       (bVar4 = str_cmp(skill_table[*(uint *)((long)vo + 0x128)].name,"reserved"), !bVar4)) break;
    send_to_char(" \'",ch);
    iVar5 = *(int *)((long)vo + 0x128);
    goto LAB_002aec45;
  case 5:
    send_to_char("It appears to be a",ch);
    if ((ulong)*(uint *)((long)vo + 0x11c) < 10) {
      pcVar7 = &DAT_0039f734 + *(int *)(&DAT_0039f734 + (ulong)*(uint *)((long)vo + 0x11c) * 4);
    }
    else {
      pcVar7 = " weapon of unknown species.\n\r";
    }
    send_to_char(pcVar7,ch);
    uVar11 = ((*(int *)((long)vo + 0x124) + 1) * *(int *)((long)vo + 0x120)) / 2;
    if (bVar4) {
      iVar5 = number_range(-5,3);
      uVar11 = uVar11 + iVar5;
      pcVar7 = "The average damage is probably around %d.\n\r";
    }
    else {
      pcVar7 = "Damage averages %d.\n\r";
    }
    sprintf(acStack_1238,pcVar7,(ulong)uVar11);
    break;
  case 6:
  case 7:
  case 8:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    goto switchD_002ae9f3_caseD_6;
  case 9:
    iVar5 = *(int *)((long)vo + 0x120) + *(int *)((long)vo + 0x11c) + *(int *)((long)vo + 0x124);
    iVar6 = iVar5 + *(int *)((long)vo + 0x128);
    iVar5 = *(int *)((long)vo + 0x128) + iVar5 + 3;
    if (-1 < iVar6) {
      iVar5 = iVar6;
    }
    sprintf(acStack_1238,"Armor class averages %d.\n\r",(ulong)(uint)(iVar5 >> 2));
    pcVar10 = acStack_1238;
    if (bVar4) goto switchD_002ae9f3_caseD_6;
    break;
  case 0xf:
    pcVar10 = "can";
    uVar11 = *(uint *)((long)vo + 0x11c);
    if (bVar4) {
      pcVar10 = "might be able to";
      iVar5 = number_range(-((int)uVar11 / 2),(int)uVar11 / 2);
      uVar11 = uVar11 + iVar5;
    }
    sprintf(acStack_1238,"It %s contain about %d objects.\n\r",pcVar10,(ulong)uVar11);
    pcVar10 = acStack_1238;
    break;
  default:
    if (*(short *)((long)vo + 0x98) != 0x1a) goto switchD_002ae9f3_caseD_6;
  case 2:
  case 10:
    sprintf(acStack_1238,"It is enchanted with level %d spells of:",
            (ulong)*(uint *)((long)vo + 0x11c));
    send_to_char(acStack_1238,ch);
    if (((ulong)*(uint *)((long)vo + 0x120) < 800) &&
       (bVar4 = str_cmp(skill_table[*(uint *)((long)vo + 0x120)].name,"reserved"), bVar4)) {
      send_to_char(" \'",ch);
      send_to_char(skill_table[*(int *)((long)vo + 0x120)].name,ch);
      send_to_char("\'",ch);
    }
    if (((ulong)*(uint *)((long)vo + 0x124) < 800) &&
       (bVar4 = str_cmp(skill_table[*(uint *)((long)vo + 0x124)].name,"reserved"), bVar4)) {
      send_to_char(" \'",ch);
      send_to_char(skill_table[*(int *)((long)vo + 0x124)].name,ch);
      send_to_char("\'",ch);
    }
    if (((ulong)*(uint *)((long)vo + 0x128) < 800) &&
       (bVar4 = str_cmp(skill_table[*(uint *)((long)vo + 0x128)].name,"reserved"), bVar4)) {
      send_to_char(" \'",ch);
      send_to_char(skill_table[*(int *)((long)vo + 0x128)].name,ch);
      send_to_char("\'",ch);
    }
    pcVar10 = ".\n\r";
    if (((ulong)*(uint *)((long)vo + 300) < 800) &&
       (bVar4 = str_cmp(skill_table[*(uint *)((long)vo + 300)].name,"reserved"), bVar4)) {
      send_to_char(" \'",ch);
      iVar5 = *(int *)((long)vo + 300);
LAB_002aec45:
      send_to_char(skill_table[iVar5].name,ch);
      send_to_char("\'",ch);
      pcVar10 = ".\n\r";
    }
  }
  send_to_char(pcVar10,ch);
switchD_002ae9f3_caseD_6:
  for (lVar2 = *(long *)((long)vo + 0x38); lVar2 != 0; lVar2 = *(long *)(lVar2 + 8)) {
    pcVar10 = affect_loc_name(0);
    sprintf(acStack_1238,"Affects %s by %d.\n\r",pcVar10,(ulong)(uint)(int)*(short *)(lVar2 + 4));
    send_to_char(acStack_1238,ch);
  }
  return;
}

Assistant:

void spell_identify(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *obj = (OBJ_DATA *)vo;
	char buf[MAX_STRING_LENGTH];
	OBJ_APPLY_DATA *app;
	int lorebonus = 0;

	if (!is_npc(ch) && (lorebonus = ch->Profs()->GetProf("forgotten lore") > -1))
	{
		send_to_char("Your knowledge of forgotten lore grants you additional insight.\n\r", ch);
		ch->Profs()->CheckImprove("forgotten lore", 100);
	}

	lorebonus = std::max(lorebonus, 0);

	sprintf(buf, "Object '%s' is type %s, extra flags %s.\n\r",
		obj->name,
		item_name_lookup(obj->item_type),
		extra_bit_name(obj->extra_flags));
	strcat(buf, "It appears to be made of ");
	strcat(buf, obj->material);
	strcat(buf, ".\n\r");
	send_to_char(buf, ch);

	switch (obj->item_type)
	{
		case ITEM_SCROLL:
		case ITEM_POTION:
		case ITEM_PILL:
			sprintf(buf, "It is enchanted with level %d spells of:", obj->value[0]);
			send_to_char(buf, ch);

			if (obj->value[1] >= 0 && obj->value[1] < MAX_SKILL && str_cmp(skill_table[obj->value[1]].name, "reserved"))
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[1]].name, ch);
				send_to_char("'", ch);
			}

			if (obj->value[2] >= 0 && obj->value[2] < MAX_SKILL && str_cmp(skill_table[obj->value[2]].name, "reserved"))
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[2]].name, ch);
				send_to_char("'", ch);
			}

			if (obj->value[3] >= 0 && obj->value[3] < MAX_SKILL && str_cmp(skill_table[obj->value[3]].name, "reserved"))
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[3]].name, ch);
				send_to_char("'", ch);
			}

			if (obj->value[4] >= 0 && obj->value[4] < MAX_SKILL && str_cmp(skill_table[obj->value[4]].name, "reserved"))
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[4]].name, ch);
				send_to_char("'", ch);
			}

			send_to_char(".\n\r", ch);
			break;
		case ITEM_WAND:
		case ITEM_STAFF:
			sprintf(buf, "It is enchanted with %d charges of level %d", obj->value[2], obj->value[0]);
			send_to_char(buf, ch);

			if (obj->value[3] >= 0 && obj->value[3] < MAX_SKILL && str_cmp(skill_table[obj->value[3]].name, "reserved"))
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[3]].name, ch);
				send_to_char("'", ch);
			}

			send_to_char(".\n\r", ch);
			break;
		case ITEM_CONTAINER:
			sprintf(buf, "It %s contain about %d objects.\n\r",
				lorebonus ? "can" : "might be able to",
				lorebonus ? obj->value[0] : obj->value[0] + number_range(obj->value[0] * -1 / 2, obj->value[0] * 1 / 2));
			send_to_char(buf, ch);

			break;
		case ITEM_WEAPON:
			send_to_char("It appears to be a", ch);

			switch (obj->value[0])
			{
				case WEAPON_EXOTIC:
					send_to_char("n exotic.\n\r", ch);
					break;
				case WEAPON_SWORD:
					send_to_char(" sword.\n\r", ch);
					break;
				case WEAPON_DAGGER:
					send_to_char(" dagger.\n\r", ch);
					break;
				case WEAPON_SPEAR:
					send_to_char(" spear/staff.\n\r", ch);
					break;
				case WEAPON_MACE:
					send_to_char(" mace/club.\n\r", ch);
					break;
				case WEAPON_AXE:
					send_to_char("n axe.\n\r", ch);
					break;
				case WEAPON_FLAIL:
					send_to_char(" flail.\n\r", ch);
					break;
				case WEAPON_WHIP:
					send_to_char(" whip.\n\r", ch);
					break;
				case WEAPON_POLEARM:
					send_to_char(" polearm.\n\r", ch);
					break;
				case WEAPON_STAFF:
					send_to_char(" staff.\n\r", ch);
					break;
				default:
					send_to_char(" weapon of unknown species.\n\r", ch);
					break;
			}

			if (lorebonus)
				sprintf(buf, "Damage averages %d.\n\r", (1 + obj->value[2]) * obj->value[1] / 2);
			else
				sprintf(buf, "The average damage is probably around %d.\n\r", ((1 + obj->value[2]) * obj->value[1] / 2) + number_range(-5, 3));

			send_to_char(buf, ch);
			break;
		case ITEM_ARMOR:
			sprintf(buf, "Armor class averages %d.\n\r", (obj->value[0] + obj->value[1] + obj->value[2] + obj->value[3]) / 4);

			if (lorebonus)
				send_to_char(buf, ch);

			break;
	}

	for (app = obj->apply; app; app = app->next)
	{
		sprintf(buf, "Affects %s by %d.\n\r", affect_loc_name(app->location), app->modifier);
		send_to_char(buf, ch);
	}
}